

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

Belief * __thiscall despot::Chain::InitialBelief(Chain *this,State *start,string *type)

{
  bool bVar1;
  int num_mdp_actions;
  FullChainBelief *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(type,"DEFAULT");
  if ((!bVar1) && (bVar1 = std::operator==(type,"FULL"), !bVar1)) {
    bVar1 = std::operator==(type,"SEMI");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Initial belief type to be supported: ");
      poVar2 = std::operator<<(poVar2,(string *)type);
      std::endl<char,std::char_traits<char>>(poVar2);
      return (Belief *)0x0;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported initial belief type: ");
    poVar2 = std::operator<<(poVar2,(string *)type);
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(0);
  }
  this_00 = (FullChainBelief *)operator_new(0x60);
  num_mdp_actions = (**(code **)(*(long *)this + 0x28))(this);
  FullChainBelief::FullChainBelief(this_00,&this->super_DSPOMDP,5,num_mdp_actions,this->alpha_);
  return &this_00->super_Belief;
}

Assistant:

Belief* Chain::InitialBelief(const State* start, string type) const {
	Belief* belief = NULL;
	if (type == "DEFAULT" || type == "FULL") {
		belief = new FullChainBelief(this, NUM_MDP_STATES, NumActions(),
			alpha_);
	} else if (type == "SEMI") {
		// belief = new SemiChainBelief(this, NUM_MDP_STATES, NumActions(), alpha_);
		cerr << "Initial belief type to be supported: " << type << endl;
	} else {
		cerr << "Unsupported initial belief type: " << type << endl;
		exit(0);
	}
	return belief;
}